

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::UniformCase::assignUniforms
          (UniformCase *this,
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,deUint32 programGL,Random *rnd)

{
  allocator<float> *this_00;
  value_type vVar1;
  DataType DVar2;
  value_type vVar3;
  int iVar4;
  bool bVar5;
  DataType targetScalarType;
  GLint location_00;
  int iVar6;
  GLenum GVar7;
  deBool dVar8;
  TestLog *this_01;
  size_type sVar9;
  const_reference str;
  MessageBuilder *pMVar10;
  GLchar *name;
  char *name_00;
  pointer pBVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  VarValue *value;
  VarValue *value_00;
  bool local_7d5;
  int local_7a4;
  int local_7a0;
  int local_79c;
  int local_798;
  float local_784;
  int local_780;
  GLint unit;
  int i_3;
  vector<int,_std::allocator<int>_> buffer_2;
  deInt32 *ptr_1;
  int i_2;
  vector<float,_std::allocator<float>_> buffer_1;
  int i_1;
  vector<float,_std::allocator<float>_> buffer;
  float *ptr;
  string local_6c8;
  MessageBuilder local_6a8;
  string local_528;
  char *local_508;
  MessageBuilder local_500;
  undefined1 local_37c [8];
  VarValue apiValue;
  __normal_iterator<const_deqp::gles2::Functional::UniformCase::BasicUniform_*,_std::vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>_>
  local_330;
  const_iterator elemUnif;
  VarValue unifValue;
  string local_2d8;
  byte local_2b2;
  byte local_2b1;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 local_250 [8];
  string curName;
  undefined1 local_228 [4];
  int i;
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  valuesToAssign;
  bool assignByValue;
  int typeSize;
  int location;
  MessageBuilder local_1f0;
  int local_6c;
  undefined1 local_68 [4];
  int numValuesToAssign;
  string queryName;
  bool isArrayMember;
  BasicUniform *uniform;
  int unifNdx;
  DataType boolApiType;
  TestLog *log;
  Random *rnd_local;
  deUint32 programGL_local;
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_local;
  UniformCase *this_local;
  
  this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  targetScalarType = TYPE_FLOAT;
  if ((*(uint *)&(this->super_CallLogWrapper).field_0x14 & 0x20) != 0) {
    targetScalarType = TYPE_INT;
  }
  uniform._0_4_ = 0;
  do {
    sVar9 = std::
            vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
            ::size(basicUniforms);
    if ((int)sVar9 <= (int)uniform) {
      return;
    }
    str = std::
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          ::operator[](basicUniforms,(long)(int)uniform);
    queryName.field_2._M_local_buf[0xf] = -1 < str->elemNdx;
    if (((*(uint *)&(this->super_CallLogWrapper).field_0x14 & 0x80) == 0) || (str->elemNdx != 0)) {
      std::__cxx11::string::string((string *)local_68,(string *)str);
    }
    else {
      beforeLast((string *)local_68,&str->name,'[');
    }
    if ((queryName.field_2._M_local_buf[0xf] & 1U) == 0) {
      local_798 = 1;
    }
    else {
      if ((*(uint *)&(this->super_CallLogWrapper).field_0x14 & 4) == 0) {
        if ((*(uint *)&(this->super_CallLogWrapper).field_0x14 & 8) == 0) {
          local_7a4 = 1;
        }
        else {
          local_7a4 = 0;
          if (str->elemNdx % 2 == 0) {
            local_7a4 = 2;
          }
        }
        local_7a0 = local_7a4;
      }
      else {
        if (str->elemNdx == 0) {
          local_79c = str->rootSize;
        }
        else {
          local_79c = 0;
        }
        local_7a0 = local_79c;
      }
      local_798 = local_7a0;
    }
    local_6c = local_798;
    if (local_798 == 0) {
      tcu::TestLog::operator<<(&local_1f0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_1f0,(char (*) [12])"// Uniform ");
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&str->name);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (pMVar10,(char (*) [60])
                                   " is covered by another glUniform*v() call to the same array");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1f0);
    }
    else {
      name = (GLchar *)std::__cxx11::string::c_str();
      location_00 = glu::CallLogWrapper::glGetUniformLocation
                              (&this->super_CallLogWrapper,programGL,name);
      iVar6 = glu::getDataTypeScalarSize(str->type);
      local_7d5 = false;
      if ((*(uint *)&(this->super_CallLogWrapper).field_0x14 & 2) != 0) {
        bVar5 = glu::isDataTypeMatrix(str->type);
        local_7d5 = false;
        if (!bVar5) {
          local_7d5 = local_6c == 1;
        }
      }
      valuesToAssign.
      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_7d5;
      std::
      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ::vector((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                *)local_228);
      for (curName.field_2._12_4_ = 0; (int)curName.field_2._12_4_ < local_6c;
          curName.field_2._12_4_ = curName.field_2._12_4_ + 1) {
        local_2b1 = 0;
        local_2b2 = 0;
        unifValue.val._59_1_ = 0;
        unifValue.val._58_1_ = 0;
        if ((queryName.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::__cxx11::string::string((string *)local_250,(string *)str);
        }
        else {
          beforeLast(&local_2b0,&str->rootName,'[');
          local_2b1 = 1;
          std::operator+(&local_290,&local_2b0,"[");
          local_2b2 = 1;
          unifValue.val.floatV[0xf] = (float)(str->elemNdx + curName.field_2._12_4_);
          de::toString<int>(&local_2d8,unifValue.val.intV + 0xf);
          unifValue.val._59_1_ = 1;
          std::operator+(&local_270,&local_290,&local_2d8);
          unifValue.val._58_1_ = 1;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_250,&local_270,"]");
        }
        if ((unifValue.val._58_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_270);
        }
        if ((unifValue.val._59_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_2d8);
        }
        if ((local_2b2 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_290);
        }
        if ((local_2b1 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_2b0);
        }
        if ((queryName.field_2._M_local_buf[0xf] & 1U) == 0) {
          memcpy((void *)((long)&elemUnif._M_current + 4),&str->finalValue,0x44);
LAB_019ca2c4:
          bVar5 = glu::isDataTypeBoolOrBVec(elemUnif._M_current._4_4_);
          if (bVar5) {
            getRandomBoolRepresentation
                      ((VarValue *)local_37c,(VarValue *)((long)&elemUnif._M_current + 4),
                       targetScalarType,rnd);
          }
          else {
            bVar5 = glu::isDataTypeSampler(elemUnif._M_current._4_4_);
            if (bVar5) {
              getSamplerUnitValue((VarValue *)local_37c,(VarValue *)((long)&elemUnif._M_current + 4)
                                 );
            }
            else {
              memcpy(local_37c,(void *)((long)&elemUnif._M_current + 4),0x44);
            }
          }
          std::
          vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
          ::push_back((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                       *)local_228,(value_type *)local_37c);
          bVar5 = glu::isDataTypeBoolOrBVec(str->type);
          if (bVar5) {
            tcu::TestLog::operator<<(&local_500,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar10 = tcu::MessageBuilder::operator<<(&local_500,(char (*) [15])"// Using type ");
            local_508 = glu::getDataTypeName(targetScalarType);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_508);
            pMVar10 = tcu::MessageBuilder::operator<<
                                (pMVar10,(char (*) [23])" to set boolean value ");
            apiVarValueStr_abi_cxx11_
                      (&local_528,(Functional *)((long)&elemUnif._M_current + 4),value);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_528);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [6])0x2a79e9c);
            pMVar10 = tcu::MessageBuilder::operator<<
                                (pMVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_250);
            tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_528);
            tcu::MessageBuilder::~MessageBuilder(&local_500);
          }
          else {
            bVar5 = glu::isDataTypeSampler(str->type);
            if (bVar5) {
              tcu::TestLog::operator<<
                        (&local_6a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar10 = tcu::MessageBuilder::operator<<
                                  (&local_6a8,(char (*) [36])"// Texture for the sampler uniform ");
              pMVar10 = tcu::MessageBuilder::operator<<
                                  (pMVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_250);
              pMVar10 = tcu::MessageBuilder::operator<<
                                  (pMVar10,(char (*) [28])" will be filled with color ");
              getSamplerFillValue((VarValue *)((long)&ptr + 4),&str->finalValue);
              apiVarValueStr_abi_cxx11_(&local_6c8,(Functional *)((long)&ptr + 4),value_00);
              pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_6c8);
              tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::string::~string((string *)&local_6c8);
              tcu::MessageBuilder::~MessageBuilder(&local_6a8);
            }
          }
        }
        else {
          name_00 = (char *)std::__cxx11::string::c_str();
          local_330._M_current = (BasicUniform *)BasicUniform::findWithName(basicUniforms,name_00);
          apiValue.val._56_8_ =
               std::
               vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
               ::end(basicUniforms);
          bVar5 = __gnu_cxx::operator==
                            (&local_330,
                             (__normal_iterator<const_deqp::gles2::Functional::UniformCase::BasicUniform_*,_std::vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>_>
                              *)((long)&apiValue.val + 0x38));
          if (!bVar5) {
            pBVar11 = __gnu_cxx::
                      __normal_iterator<const_deqp::gles2::Functional::UniformCase::BasicUniform_*,_std::vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>_>
                      ::operator->(&local_330);
            memcpy((void *)((long)&elemUnif._M_current + 4),&pBVar11->finalValue,0x44);
            goto LAB_019ca2c4;
          }
        }
        std::__cxx11::string::~string((string *)local_250);
      }
      pvVar12 = std::
                vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                ::operator[]((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_228,0);
      bVar5 = glu::isDataTypeFloatOrVec(pvVar12->type);
      if (bVar5) {
        if ((valuesToAssign.
             super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
          sVar9 = std::
                  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                  ::size((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                          *)local_228);
          this_00 = (allocator<float> *)
                    ((long)&buffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 7);
          std::allocator<float>::allocator(this_00);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&i_1,sVar9 * (long)iVar6,this_00);
          std::allocator<float>::~allocator
                    ((allocator<float> *)
                     ((long)&buffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
          for (buffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
              iVar4 = (int)buffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
              sVar9 = std::vector<float,_std::allocator<float>_>::size
                                ((vector<float,_std::allocator<float>_> *)&i_1), iVar4 < (int)sVar9;
              buffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ =
                   (int)buffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 1) {
            pvVar12 = std::
                      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                      ::operator[]((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                    *)local_228,
                                   (long)((int)buffer_1.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage /
                                         iVar6));
            vVar1 = *(value_type *)
                     ((long)&pvVar12->val +
                     (long)((int)buffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage % iVar6) * 4);
            pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)&i_1,
                                 (long)(int)buffer_1.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
            *pvVar13 = vVar1;
          }
          switch(iVar6) {
          case 1:
            do {
              sVar9 = std::
                      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_228);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_1,0);
              glu::CallLogWrapper::glUniform1fv
                        (&this->super_CallLogWrapper,location_00,(GLsizei)sVar9,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glUniform1fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x61b);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case 2:
            do {
              sVar9 = std::
                      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_228);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_1,0);
              glu::CallLogWrapper::glUniform2fv
                        (&this->super_CallLogWrapper,location_00,(GLsizei)sVar9,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glUniform2fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x61c);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case 3:
            do {
              sVar9 = std::
                      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_228);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_1,0);
              glu::CallLogWrapper::glUniform3fv
                        (&this->super_CallLogWrapper,location_00,(GLsizei)sVar9,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glUniform3fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x61d);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case 4:
            do {
              sVar9 = std::
                      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_228);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_1,0);
              glu::CallLogWrapper::glUniform4fv
                        (&this->super_CallLogWrapper,location_00,(GLsizei)sVar9,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glUniform4fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x61e);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
          }
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)&i_1);
        }
        else {
          pvVar12 = std::
                    vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                    ::operator[]((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                  *)local_228,0);
          buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)&pvVar12->val;
          switch(iVar6) {
          case 1:
            do {
              glu::CallLogWrapper::glUniform1f
                        (&this->super_CallLogWrapper,location_00,
                         *buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,"glUniform1f(location, ptr[0])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x60a);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case 2:
            do {
              glu::CallLogWrapper::glUniform2f
                        (&this->super_CallLogWrapper,location_00,
                         *buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[1]);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,"glUniform2f(location, ptr[0], ptr[1])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x60b);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case 3:
            do {
              glu::CallLogWrapper::glUniform3f
                        (&this->super_CallLogWrapper,location_00,
                         *buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[1],
                         buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[2]);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,"glUniform3f(location, ptr[0], ptr[1], ptr[2])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x60c);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case 4:
            do {
              glu::CallLogWrapper::glUniform4f
                        (&this->super_CallLogWrapper,location_00,
                         *buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[1],
                         buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[2],
                         buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[3]);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,"glUniform4f(location, ptr[0], ptr[1], ptr[2], ptr[3])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x60d);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
          }
        }
      }
      else {
        pvVar12 = std::
                  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                  ::operator[]((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                *)local_228,0);
        bVar5 = glu::isDataTypeMatrix(pvVar12->type);
        if (bVar5) {
          sVar9 = std::
                  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                  ::size((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                          *)local_228);
          std::allocator<float>::allocator((allocator<float> *)((long)&ptr_1 + 7));
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&i_2,sVar9 * (long)iVar6,
                     (allocator<float> *)((long)&ptr_1 + 7));
          std::allocator<float>::~allocator((allocator<float> *)((long)&ptr_1 + 7));
          for (ptr_1._0_4_ = 0; iVar4 = (int)ptr_1,
              sVar9 = std::vector<float,_std::allocator<float>_>::size
                                ((vector<float,_std::allocator<float>_> *)&i_2), iVar4 < (int)sVar9;
              ptr_1._0_4_ = (int)ptr_1 + 1) {
            pvVar12 = std::
                      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                      ::operator[]((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                    *)local_228,(long)((int)ptr_1 / iVar6));
            vVar1 = *(value_type *)((long)&pvVar12->val + (long)((int)ptr_1 % iVar6) * 4);
            pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)&i_2,(long)(int)ptr_1);
            *pvVar13 = vVar1;
          }
          DVar2 = str->type;
          if (DVar2 == TYPE_FLOAT_MAT2) {
            do {
              sVar9 = std::
                      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_228);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_2,0);
              glu::CallLogWrapper::glUniformMatrix2fv
                        (&this->super_CallLogWrapper,location_00,(GLsizei)sVar9,'\0',pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glUniformMatrix2fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x62e);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
          }
          else if (DVar2 == TYPE_FLOAT_MAT3) {
            do {
              sVar9 = std::
                      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_228);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_2,0);
              glu::CallLogWrapper::glUniformMatrix3fv
                        (&this->super_CallLogWrapper,location_00,(GLsizei)sVar9,'\0',pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glUniformMatrix3fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x62f);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
          }
          else if (DVar2 == TYPE_FLOAT_MAT4) {
            do {
              sVar9 = std::
                      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_228);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_2,0);
              glu::CallLogWrapper::glUniformMatrix4fv
                        (&this->super_CallLogWrapper,location_00,(GLsizei)sVar9,'\0',pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glUniformMatrix4fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x630);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
          }
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)&i_2);
        }
        else {
          pvVar12 = std::
                    vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                    ::operator[]((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                  *)local_228,0);
          bVar5 = glu::isDataTypeIntOrIVec(pvVar12->type);
          if (bVar5) {
            if ((valuesToAssign.
                 super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
              sVar9 = std::
                      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_228);
              std::allocator<int>::allocator((allocator<int> *)((long)&unit + 3));
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&i_3,sVar9 * (long)iVar6,
                         (allocator<int> *)((long)&unit + 3));
              std::allocator<int>::~allocator((allocator<int> *)((long)&unit + 3));
              for (local_780 = 0; iVar4 = local_780,
                  sVar9 = std::vector<int,_std::allocator<int>_>::size
                                    ((vector<int,_std::allocator<int>_> *)&i_3), iVar4 < (int)sVar9;
                  local_780 = local_780 + 1) {
                pvVar12 = std::
                          vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                          ::operator[]((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                        *)local_228,(long)(local_780 / iVar6));
                vVar3 = *(value_type *)((long)&pvVar12->val + (long)(local_780 % iVar6) * 4);
                pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)&i_3,(long)local_780);
                *pvVar14 = vVar3;
              }
              switch(iVar6) {
              case 1:
                do {
                  sVar9 = std::
                          vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                          ::size((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                  *)local_228);
                  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)&i_3,0);
                  glu::CallLogWrapper::glUniform1iv
                            (&this->super_CallLogWrapper,location_00,(GLsizei)sVar9,pvVar14);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,
                                  "glUniform1iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                                  ,0x64e);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
                break;
              case 2:
                do {
                  sVar9 = std::
                          vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                          ::size((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                  *)local_228);
                  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)&i_3,0);
                  glu::CallLogWrapper::glUniform2iv
                            (&this->super_CallLogWrapper,location_00,(GLsizei)sVar9,pvVar14);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,
                                  "glUniform2iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                                  ,0x64f);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
                break;
              case 3:
                do {
                  sVar9 = std::
                          vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                          ::size((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                  *)local_228);
                  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)&i_3,0);
                  glu::CallLogWrapper::glUniform3iv
                            (&this->super_CallLogWrapper,location_00,(GLsizei)sVar9,pvVar14);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,
                                  "glUniform3iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                                  ,0x650);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
                break;
              case 4:
                do {
                  sVar9 = std::
                          vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                          ::size((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                  *)local_228);
                  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)&i_3,0);
                  glu::CallLogWrapper::glUniform4iv
                            (&this->super_CallLogWrapper,location_00,(GLsizei)sVar9,pvVar14);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,
                                  "glUniform4iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                                  ,0x651);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
              }
              std::vector<int,_std::allocator<int>_>::~vector
                        ((vector<int,_std::allocator<int>_> *)&i_3);
            }
            else {
              pvVar12 = std::
                        vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                        ::operator[]((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                      *)local_228,0);
              buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage = (pointer)&pvVar12->val;
              switch(iVar6) {
              case 1:
                do {
                  glu::CallLogWrapper::glUniform1i
                            (&this->super_CallLogWrapper,location_00,
                             *buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,"glUniform1i(location, ptr[0])",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                                  ,0x63d);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
                break;
              case 2:
                do {
                  glu::CallLogWrapper::glUniform2i
                            (&this->super_CallLogWrapper,location_00,
                             *buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[1]);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,"glUniform2i(location, ptr[0], ptr[1])",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                                  ,0x63e);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
                break;
              case 3:
                do {
                  glu::CallLogWrapper::glUniform3i
                            (&this->super_CallLogWrapper,location_00,
                             *buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[1],
                             buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[2]);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,"glUniform3i(location, ptr[0], ptr[1], ptr[2])",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                                  ,0x63f);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
                break;
              case 4:
                do {
                  glu::CallLogWrapper::glUniform4i
                            (&this->super_CallLogWrapper,location_00,
                             *buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[1],
                             buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[2],
                             buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[3]);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,"glUniform4i(location, ptr[0], ptr[1], ptr[2], ptr[3])",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                                  ,0x640);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
              }
            }
          }
          else {
            pvVar12 = std::
                      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                      ::operator[]((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                    *)local_228,0);
            bVar5 = glu::isDataTypeSampler(pvVar12->type);
            if (bVar5) {
              if ((valuesToAssign.
                   super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
                local_784 = (str->finalValue).val.floatV[0];
                do {
                  sVar9 = std::
                          vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                          ::size((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                  *)local_228);
                  glu::CallLogWrapper::glUniform1iv
                            (&this->super_CallLogWrapper,location_00,(GLsizei)sVar9,
                             (GLint *)&local_784);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,
                                  "glUniform1iv(location, (GLsizei)valuesToAssign.size(), &unit)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                                  ,0x65e);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
              }
              else {
                do {
                  glu::CallLogWrapper::glUniform1i
                            (&this->super_CallLogWrapper,location_00,(str->finalValue).val.intV[0]);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,
                                  "glUniform1i(location, uniform.finalValue.val.samplerV.unit)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                                  ,0x65a);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
              }
            }
          }
        }
      }
      std::
      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ::~vector((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                 *)local_228);
    }
    std::__cxx11::string::~string((string *)local_68);
    uniform._0_4_ = (int)uniform + 1;
  } while( true );
}

Assistant:

void UniformCase::assignUniforms (const vector<BasicUniform>& basicUniforms, deUint32 programGL, Random& rnd)
{
	TestLog&				log				= m_testCtx.getLog();
	const glu::DataType		boolApiType		= m_features & FEATURE_BOOLEANAPITYPE_INT	? glu::TYPE_INT
											:											  glu::TYPE_FLOAT;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform				= basicUniforms[unifNdx];
		const bool				isArrayMember		= uniform.elemNdx >= 0;
		const string			queryName			= m_features & FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX && uniform.elemNdx == 0 ? beforeLast(uniform.name, '[') : uniform.name;
		const int				numValuesToAssign	= !isArrayMember									? 1
													: m_features & FEATURE_ARRAYASSIGN_FULL				? (uniform.elemNdx == 0			? uniform.rootSize	: 0)
													: m_features & FEATURE_ARRAYASSIGN_BLOCKS_OF_TWO	? (uniform.elemNdx % 2 == 0		? 2					: 0)
													: /* Default: assign array elements separately */	  1;

		DE_ASSERT(numValuesToAssign >= 0);
		DE_ASSERT(numValuesToAssign == 1 || isArrayMember);

		if (numValuesToAssign == 0)
		{
			log << TestLog::Message << "// Uniform " << uniform.name << " is covered by another glUniform*v() call to the same array" << TestLog::EndMessage;
			continue;
		}

		const int			location			= glGetUniformLocation(programGL, queryName.c_str());
		const int			typeSize			= glu::getDataTypeScalarSize(uniform.type);
		const bool			assignByValue		= m_features & FEATURE_UNIFORMFUNC_VALUE && !glu::isDataTypeMatrix(uniform.type) && numValuesToAssign == 1;
		vector<VarValue>	valuesToAssign;

		for (int i = 0; i < numValuesToAssign; i++)
		{
			const string	curName = isArrayMember ? beforeLast(uniform.rootName, '[') + "[" + de::toString(uniform.elemNdx+i) + "]" : uniform.name;
			VarValue		unifValue;

			if (isArrayMember)
			{
				const vector<BasicUniform>::const_iterator elemUnif = BasicUniform::findWithName(basicUniforms, curName.c_str());
				if (elemUnif == basicUniforms.end())
					continue;
				unifValue = elemUnif->finalValue;
			}
			else
				unifValue = uniform.finalValue;

			const VarValue apiValue = glu::isDataTypeBoolOrBVec(unifValue.type)	? getRandomBoolRepresentation(unifValue, boolApiType, rnd)
									: glu::isDataTypeSampler(unifValue.type)	? getSamplerUnitValue(unifValue)
									: unifValue;

			valuesToAssign.push_back(apiValue);

			if (glu::isDataTypeBoolOrBVec(uniform.type))
				log << TestLog::Message << "// Using type " << glu::getDataTypeName(boolApiType) << " to set boolean value " << apiVarValueStr(unifValue) << " for " << curName << TestLog::EndMessage;
			else if (glu::isDataTypeSampler(uniform.type))
				log << TestLog::Message << "// Texture for the sampler uniform " << curName << " will be filled with color " << apiVarValueStr(getSamplerFillValue(uniform.finalValue)) << TestLog::EndMessage;
		}

		DE_ASSERT(!valuesToAssign.empty());

		if (glu::isDataTypeFloatOrVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const float* const ptr = &valuesToAssign[0].val.floatV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glUniform1f(location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glUniform2f(location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glUniform3f(location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glUniform4f(location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<float> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.floatV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glUniform1fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glUniform2fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glUniform3fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glUniform4fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeMatrix(valuesToAssign[0].type))
		{
			DE_ASSERT(!assignByValue);

			vector<float> buffer(valuesToAssign.size() * typeSize);
			for (int i = 0; i < (int)buffer.size(); i++)
				buffer[i] = valuesToAssign[i / typeSize].val.floatV[i % typeSize];

			switch (uniform.type)
			{
				case glu::TYPE_FLOAT_MAT2: GLU_CHECK_CALL(glUniformMatrix2fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT3: GLU_CHECK_CALL(glUniformMatrix3fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT4: GLU_CHECK_CALL(glUniformMatrix4fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])); break;
				default:
					DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeIntOrIVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const deInt32* const ptr = &valuesToAssign[0].val.intV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glUniform1i(location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glUniform2i(location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glUniform3i(location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glUniform4i(location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<deInt32> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.intV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLint) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glUniform1iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glUniform2iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glUniform3iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glUniform4iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeSampler(valuesToAssign[0].type))
		{
			if (assignByValue)
				GLU_CHECK_CALL(glUniform1i(location, uniform.finalValue.val.samplerV.unit));
			else
			{
				const GLint unit = uniform.finalValue.val.samplerV.unit;
				GLU_CHECK_CALL(glUniform1iv(location, (GLsizei)valuesToAssign.size(), &unit));
			}
		}
		else
			DE_ASSERT(false);
	}
}